

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.cpp
# Opt level: O1

void __thiscall psy::C::NameCatalog::markIndexedNodeAsEncloser(NameCatalog *this,SyntaxNode *node)

{
  iterator *piVar1;
  _Elt_pointer ppSVar2;
  size_type sVar3;
  ostream *poVar4;
  SyntaxNode *local_18;
  SyntaxNode *local_10;
  
  local_18 = node;
  if (node != (SyntaxNode *)0x0) {
    local_10 = node;
    sVar3 = std::_Hashtable<$aed754b5$>::count(&(this->enclosureIdx_)._M_h,&local_10);
    if (sVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
                 ,0x5e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
    else {
      ppSVar2 = (this->enclosureStack_).c.
                super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppSVar2 ==
          (this->enclosureStack_).c.
          super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>>::
        _M_push_back_aux<psy::C::SyntaxNode_const*const&>
                  ((deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>> *)
                   this,&local_18);
      }
      else {
        *ppSVar2 = local_18;
        piVar1 = &(this->enclosureStack_).c.
                  super__Deque_base<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/NameCatalog.cpp"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<empty message>",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void NameCatalog::markIndexedNodeAsEncloser(const SyntaxNode* node)
{
    PSY_ASSERT_2(node, return);
    PSY_ASSERT_2(isIndexed(node), return);

    enclosureStack_.push(node);
}